

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

char * Curl_checkProxyheaders(connectdata *conn,char *thisheader)

{
  int iVar1;
  size_t max;
  long lVar2;
  undefined8 *puVar3;
  
  max = strlen(thisheader);
  if (((conn->bits).proxy != true) || (lVar2 = 0x3c0, (conn->data->set).sep_headers == false)) {
    lVar2 = 0x3b8;
  }
  puVar3 = *(undefined8 **)((long)conn->data->sockets + lVar2 + -0x38);
  while( true ) {
    if (puVar3 == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    iVar1 = Curl_strncasecompare((char *)*puVar3,thisheader,max);
    if (iVar1 != 0) break;
    puVar3 = (undefined8 *)puVar3[1];
  }
  return (char *)*puVar3;
}

Assistant:

char *Curl_checkProxyheaders(const struct connectdata *conn,
                             const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);
  struct Curl_easy *data = conn->data;

  for(head = (conn->bits.proxy && data->set.sep_headers) ?
        data->set.proxyheaders : data->set.headers;
      head; head=head->next) {
    if(strncasecompare(head->data, thisheader, thislen))
      return head->data;
  }

  return NULL;
}